

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O3

void sptk::world::cftmdl1(int n,double *a,double *w)

{
  double dVar1;
  ulong uVar2;
  long lVar3;
  double *pdVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  
  uVar6 = n >> 3;
  lVar3 = (long)(int)(uVar6 * 2);
  dVar13 = a[(int)(uVar6 * 4)];
  dVar14 = (a + (int)(uVar6 * 4))[1];
  dVar15 = *a - dVar13;
  dVar16 = a[1] - dVar14;
  dVar17 = a[lVar3];
  dVar18 = (a + lVar3)[1];
  dVar22 = a[(int)(uVar6 * 6)];
  dVar26 = (a + (int)(uVar6 * 6))[1];
  dVar19 = dVar17 - dVar22;
  dVar20 = dVar18 - dVar26;
  dVar13 = *a + dVar13;
  dVar14 = a[1] + dVar14;
  dVar17 = dVar17 + dVar22;
  dVar18 = dVar18 + dVar26;
  *a = dVar13 + dVar17;
  a[1] = dVar14 + dVar18;
  a[lVar3] = dVar13 - dVar17;
  (a + lVar3)[1] = dVar14 - dVar18;
  a[(int)(uVar6 * 4)] = dVar15 - dVar20;
  (a + (int)(uVar6 * 4))[1] = dVar19 + dVar16;
  a[(int)(uVar6 * 6)] = dVar20 + dVar15;
  (a + (int)(uVar6 * 6))[1] = dVar16 - dVar19;
  dVar13 = w[1];
  if ((int)uVar6 < 3) {
    uVar2 = (ulong)(int)uVar6;
  }
  else {
    uVar2 = (ulong)uVar6;
    pdVar4 = w + 7;
    lVar8 = lVar3 << 4;
    lVar10 = lVar3 << 5;
    lVar5 = lVar3 * 0x18;
    lVar11 = lVar3 * 0x18;
    uVar12 = 2;
    lVar7 = lVar3;
    lVar9 = lVar8;
    do {
      lVar9 = lVar9 + -0x10;
      lVar7 = lVar7 + -2;
      lVar11 = lVar11 + 0x10;
      lVar10 = lVar10 + -0x10;
      lVar8 = lVar8 + 0x10;
      lVar5 = lVar5 + -0x10;
      lVar3 = lVar3 + 2;
      dVar26 = a[uVar12];
      dVar15 = (a + uVar12)[1];
      dVar16 = *(double *)((long)a + lVar8);
      dVar19 = ((double *)((long)a + lVar8))[1];
      dVar20 = a[lVar3];
      dVar21 = (a + lVar3)[1];
      dVar27 = dVar26 + dVar16;
      dVar28 = dVar15 + dVar19;
      dVar23 = *(double *)((long)a + lVar11);
      dVar1 = ((double *)((long)a + lVar11))[1];
      dVar14 = pdVar4[-3];
      dVar24 = dVar20 + dVar23;
      dVar25 = dVar21 + dVar1;
      dVar17 = pdVar4[-2];
      dVar18 = pdVar4[-1];
      dVar22 = *pdVar4;
      dVar26 = dVar26 - dVar16;
      dVar15 = dVar15 - dVar19;
      a[uVar12] = dVar27 + dVar24;
      (a + uVar12)[1] = dVar28 + dVar25;
      dVar20 = dVar20 - dVar23;
      dVar21 = dVar21 - dVar1;
      a[lVar3] = dVar27 - dVar24;
      (a + lVar3)[1] = dVar28 - dVar25;
      dVar16 = dVar26 - dVar21;
      dVar19 = dVar15 - dVar20;
      dVar21 = dVar21 + dVar26;
      dVar20 = dVar20 + dVar15;
      *(double *)((long)a + lVar8) = dVar14 * dVar16 + -dVar17 * dVar20;
      ((double *)((long)a + lVar8))[1] = dVar14 * dVar20 + dVar17 * dVar16;
      *(double *)((long)a + lVar11) = dVar18 * dVar21 + dVar19 * dVar22;
      ((double *)((long)a + lVar11))[1] = dVar18 * dVar19 + dVar21 * -dVar22;
      dVar26 = a[lVar7];
      dVar15 = (a + lVar7)[1];
      dVar16 = *(double *)((long)a + lVar5);
      dVar19 = ((double *)((long)a + lVar5))[1];
      dVar20 = *(double *)((long)a + lVar9);
      dVar21 = ((double *)((long)a + lVar9))[1];
      dVar24 = dVar26 + dVar16;
      dVar25 = dVar15 + dVar19;
      dVar23 = *(double *)((long)a + lVar10);
      dVar1 = ((double *)((long)a + lVar10))[1];
      dVar27 = dVar20 + dVar23;
      dVar28 = dVar21 + dVar1;
      dVar26 = dVar26 - dVar16;
      dVar15 = dVar15 - dVar19;
      dVar20 = dVar20 - dVar23;
      dVar21 = dVar21 - dVar1;
      a[lVar7] = dVar24 + dVar27;
      (a + lVar7)[1] = dVar25 + dVar28;
      dVar16 = dVar26 - dVar21;
      dVar19 = dVar15 - dVar20;
      dVar21 = dVar21 + dVar26;
      dVar20 = dVar20 + dVar15;
      *(double *)((long)a + lVar9) = dVar24 - dVar27;
      ((double *)((long)a + lVar9))[1] = dVar25 - dVar28;
      *(double *)((long)a + lVar5) = dVar17 * dVar16 + -dVar14 * dVar20;
      ((double *)((long)a + lVar5))[1] = dVar17 * dVar20 + dVar14 * dVar16;
      uVar12 = uVar12 + 2;
      pdVar4 = pdVar4 + 4;
      *(double *)((long)a + lVar10) = dVar22 * dVar21 + dVar19 * dVar18;
      ((double *)((long)a + lVar10))[1] = dVar22 * dVar19 + dVar21 * -dVar18;
    } while (uVar12 < uVar2);
  }
  lVar5 = (long)(int)(uVar6 * 5);
  lVar3 = (long)(int)(uVar6 * 7);
  dVar14 = a[uVar2];
  dVar17 = (a + uVar2)[1];
  dVar18 = a[lVar5];
  dVar22 = (a + lVar5)[1];
  dVar20 = dVar14 + dVar18;
  dVar21 = dVar17 + dVar22;
  dVar14 = dVar14 - dVar18;
  dVar17 = dVar17 - dVar22;
  dVar18 = a[(int)(uVar6 * 3)];
  dVar22 = (a + (int)(uVar6 * 3))[1];
  dVar26 = a[lVar3];
  dVar15 = (a + lVar3)[1];
  dVar19 = dVar18 - dVar26;
  dVar16 = dVar22 - dVar15;
  dVar23 = dVar14 - dVar16;
  dVar16 = dVar16 + dVar14;
  dVar18 = dVar18 + dVar26;
  dVar22 = dVar22 + dVar15;
  a[uVar2] = dVar20 + dVar18;
  (a + uVar2)[1] = dVar21 + dVar22;
  a[(int)(uVar6 * 3)] = dVar20 - dVar18;
  (a + (int)(uVar6 * 3))[1] = dVar21 - dVar22;
  dVar14 = dVar17 + dVar19;
  a[lVar5] = (dVar23 - dVar14) * dVar13;
  a[lVar5 + 1] = (dVar14 + dVar23) * dVar13;
  dVar17 = dVar17 - dVar19;
  a[lVar3] = (dVar17 + dVar16) * -dVar13;
  a[lVar3 + 1] = (dVar17 - dVar16) * -dVar13;
  return;
}

Assistant:

void cftmdl1(int n, double *a, double *w) {
  int j, j0, j1, j2, j3, k, m, mh;
  double wn4r, wk1r, wk1i, wk3r, wk3i;
  double x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i;

  mh = n >> 3;
  m = 2 * mh;
  j1 = m;
  j2 = j1 + m;
  j3 = j2 + m;
  x0r = a[0] + a[j2];
  x0i = a[1] + a[j2 + 1];
  x1r = a[0] - a[j2];
  x1i = a[1] - a[j2 + 1];
  x2r = a[j1] + a[j3];
  x2i = a[j1 + 1] + a[j3 + 1];
  x3r = a[j1] - a[j3];
  x3i = a[j1 + 1] - a[j3 + 1];
  a[0] = x0r + x2r;
  a[1] = x0i + x2i;
  a[j1] = x0r - x2r;
  a[j1 + 1] = x0i - x2i;
  a[j2] = x1r - x3i;
  a[j2 + 1] = x1i + x3r;
  a[j3] = x1r + x3i;
  a[j3 + 1] = x1i - x3r;
  wn4r = w[1];
  k = 0;
  for (j = 2; j < mh; j += 2) {
    k += 4;
    wk1r = w[k];
    wk1i = w[k + 1];
    wk3r = w[k + 2];
    wk3i = w[k + 3];
    j1 = j + m;
    j2 = j1 + m;
    j3 = j2 + m;
    x0r = a[j] + a[j2];
    x0i = a[j + 1] + a[j2 + 1];
    x1r = a[j] - a[j2];
    x1i = a[j + 1] - a[j2 + 1];
    x2r = a[j1] + a[j3];
    x2i = a[j1 + 1] + a[j3 + 1];
    x3r = a[j1] - a[j3];
    x3i = a[j1 + 1] - a[j3 + 1];
    a[j] = x0r + x2r;
    a[j + 1] = x0i + x2i;
    a[j1] = x0r - x2r;
    a[j1 + 1] = x0i - x2i;
    x0r = x1r - x3i;
    x0i = x1i + x3r;
    a[j2] = wk1r * x0r - wk1i * x0i;
    a[j2 + 1] = wk1r * x0i + wk1i * x0r;
    x0r = x1r + x3i;
    x0i = x1i - x3r;
    a[j3] = wk3r * x0r + wk3i * x0i;
    a[j3 + 1] = wk3r * x0i - wk3i * x0r;
    j0 = m - j;
    j1 = j0 + m;
    j2 = j1 + m;
    j3 = j2 + m;
    x0r = a[j0] + a[j2];
    x0i = a[j0 + 1] + a[j2 + 1];
    x1r = a[j0] - a[j2];
    x1i = a[j0 + 1] - a[j2 + 1];
    x2r = a[j1] + a[j3];
    x2i = a[j1 + 1] + a[j3 + 1];
    x3r = a[j1] - a[j3];
    x3i = a[j1 + 1] - a[j3 + 1];
    a[j0] = x0r + x2r;
    a[j0 + 1] = x0i + x2i;
    a[j1] = x0r - x2r;
    a[j1 + 1] = x0i - x2i;
    x0r = x1r - x3i;
    x0i = x1i + x3r;
    a[j2] = wk1i * x0r - wk1r * x0i;
    a[j2 + 1] = wk1i * x0i + wk1r * x0r;
    x0r = x1r + x3i;
    x0i = x1i - x3r;
    a[j3] = wk3i * x0r + wk3r * x0i;
    a[j3 + 1] = wk3i * x0i - wk3r * x0r;
  }
  j0 = mh;
  j1 = j0 + m;
  j2 = j1 + m;
  j3 = j2 + m;
  x0r = a[j0] + a[j2];
  x0i = a[j0 + 1] + a[j2 + 1];
  x1r = a[j0] - a[j2];
  x1i = a[j0 + 1] - a[j2 + 1];
  x2r = a[j1] + a[j3];
  x2i = a[j1 + 1] + a[j3 + 1];
  x3r = a[j1] - a[j3];
  x3i = a[j1 + 1] - a[j3 + 1];
  a[j0] = x0r + x2r;
  a[j0 + 1] = x0i + x2i;
  a[j1] = x0r - x2r;
  a[j1 + 1] = x0i - x2i;
  x0r = x1r - x3i;
  x0i = x1i + x3r;
  a[j2] = wn4r * (x0r - x0i);
  a[j2 + 1] = wn4r * (x0i + x0r);
  x0r = x1r + x3i;
  x0i = x1i - x3r;
  a[j3] = -wn4r * (x0r + x0i);
  a[j3 + 1] = -wn4r * (x0i - x0r);
}